

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfor2008.h
# Opt level: O2

void __thiscall FastPForLib::PFor2008::PFor2008(PFor2008 *this)

{
  allocator_type local_12;
  allocator_type local_11;
  
  (this->super_IntegerCODEC)._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001bb050;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->codedcopy,0x80,&local_11);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->miss,0x80,&local_12);
  return;
}

Assistant:

PFor2008() : codedcopy(BlockSize), miss(BlockSize) {}